

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-cda-bench.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  _Link_type p_Var1;
  _Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false> _Var2;
  unique_ptr<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
  uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [8];
  _Base_ptr p_Var6;
  char cVar7;
  int iVar8;
  uint uVar9;
  int extraout_EAX;
  LLVMControlDependenceAnalysis *pLVar10;
  tuple<dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
  tVar11;
  clock_t cVar12;
  clock_t cVar13;
  ostream *poVar14;
  _Base_ptr p_Var15;
  undefined1 *puVar16;
  mapped_type *pmVar17;
  BasicBlock *pBVar18;
  pointer pSVar19;
  _Link_type p_Var20;
  pointer pSVar21;
  ulong uVar22;
  Module *pMVar23;
  undefined1 *puVar24;
  _Link_type p_Var25;
  _Vector_base<StackNode,_std::allocator<StackNode>_> *p_Var26;
  _Base_ptr p_Var27;
  Module *pMVar28;
  BasicBlock *pBVar29;
  pointer pSVar30;
  pointer *__ptr;
  int iVar31;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
  *it;
  pointer ptVar32;
  ulong uVar33;
  key_type *ppBVar34;
  undefined1 *puVar35;
  undefined1 *puVar36;
  pointer pSVar37;
  int iVar38;
  Module *pMVar39;
  long lVar40;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
  *it_1;
  Function *pFVar41;
  pointer ptVar42;
  _Vector_base<StackNode,_std::allocator<StackNode>_> *this;
  pointer pSVar43;
  bool bVar44;
  undefined1 auVar45 [16];
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
  analyses;
  vector<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
  results;
  Value *d;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
  *it_2;
  Function *__range3;
  iterator __end3;
  LLVMContext context;
  SlicerOptions options;
  key_type pBStack_440;
  pointer pSStack_438;
  ulong uStack_430;
  int iStack_428;
  int iStack_424;
  undefined1 auStack_420 [16];
  _Link_type p_Stack_410;
  _Base_ptr p_Stack_408;
  _Base_ptr p_Stack_400;
  size_t sStack_3f8;
  ulong uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3b8 [24];
  undefined1 local_3a0 [8];
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
  local_398;
  _Base_ptr local_378;
  uint local_36c;
  undefined1 local_368 [40];
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  local_340;
  CDAlgorithm local_310;
  bool local_30c;
  undefined2 local_30b;
  Module *local_300;
  Module *local_2f8;
  pointer local_2f0;
  Module *local_2e8;
  Module *local_2e0;
  LLVMControlDependenceAnalysis *local_2d8;
  Module *local_2d0;
  Module *local_2c8;
  pointer local_2c0;
  Module *local_2b8;
  _Base_ptr local_2b0;
  undefined1 local_2a8 [280];
  size_type local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  _Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false> local_170;
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  local_168;
  CDAlgorithm local_138;
  undefined1 local_134;
  undefined2 local_133;
  
  setupStackTraceOnError(argc,argv);
  puVar35 = local_2a8 + 8;
  iVar8 = 1;
  parseSlicerOptions((int)puVar35,(char **)(ulong)(uint)argc,SUB81(argv,0),false);
  if (total_only[0x80] == '\x01') {
    local_368[0] = 1;
    quiet[0x80] = '\x01';
    if (quiet._176_8_ == 0) {
      std::__throw_bad_function_call();
      uStack_3e8 = 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Function \'",10);
      auVar45 = llvm::Value::getName();
      lVar40 = auVar45._0_8_;
      auStack_420._0_8_ = &p_Stack_410;
      if (lVar40 == 0) {
        auStack_420._8_8_ = 0;
        p_Stack_410 = (_Link_type)((ulong)p_Stack_410 & 0xffffffffffffff00);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)auStack_420,lVar40,auVar45._8_8_ + lVar40);
      }
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)auStack_420._0_8_,auStack_420._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\'\n",2);
      if ((_Link_type *)auStack_420._0_8_ != &p_Stack_410) {
        operator_delete((void *)auStack_420._0_8_,
                        (ulong)((long)&(p_Stack_410->super__Rb_tree_node_base)._M_color + 1));
      }
      uVar33 = 0;
      pSVar19 = (pointer)puVar35;
      for (puVar16 = *(undefined1 **)(puVar35 + 0x50); puVar16 != puVar35 + 0x48;
          puVar16 = *(undefined1 **)(puVar16 + 8)) {
        puVar36 = puVar16 + -0x18;
        if (puVar16 == (undefined1 *)0x0) {
          puVar36 = (undefined1 *)0x0;
        }
        puVar24 = *(undefined1 **)(puVar36 + 0x30);
        iVar8 = 0;
        iVar38 = 0;
        if (puVar24 != puVar36 + 0x28) {
          iVar38 = 0;
          do {
            puVar24 = *(undefined1 **)(puVar24 + 8);
            iVar38 = iVar38 + 1;
          } while (puVar24 != puVar36 + 0x28);
        }
        pSStack_438 = pSVar19;
        lVar40 = llvm::BasicBlock::getTerminator();
        if (lVar40 != 0) {
          iVar8 = llvm::Instruction::getNumSuccessors();
        }
        if (iVar8 != 0) {
          iVar31 = 0;
          uStack_430 = uVar33;
          do {
            llvm::Instruction::getSuccessor((uint)lVar40);
            iVar31 = iVar31 + 1;
            uVar33 = uStack_430;
          } while (iVar8 != iVar31);
        }
        uVar33 = (ulong)(uint)((int)uVar33 + iVar38);
        pSVar19 = pSStack_438;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  bblocks: ",0xb);
      for (puVar16 = *(undefined1 **)((long)pSVar19 + 0x50); puVar16 != puVar35 + 0x48;
          puVar16 = *(undefined1 **)(puVar16 + 8)) {
      }
      poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  instructions: ",0x10);
      poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  branches: ",0xc);
      poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  blind ends: ",0xe)
      ;
      poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
      p_Stack_408 = (_Base_ptr)(auStack_420 + 8);
      auStack_420._8_8_ = auStack_420._8_8_ & 0xffffffff00000000;
      pBVar18 = (BasicBlock *)0x0;
      p_Stack_410 = (_Link_type)0x0;
      sStack_3f8 = 0;
      pBStack_440 = (key_type)(*(long *)((long)pSVar19 + 0x50) + -0x18);
      if (*(long *)((long)pSVar19 + 0x50) == 0) {
        pBStack_440 = (key_type)0x0;
      }
      ppBVar34 = &pBStack_440;
      p_Stack_400 = p_Stack_408;
      pmVar17 = std::
                map<const_llvm::BasicBlock_*,_bool,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_bool>_>_>
                ::operator[]((map<const_llvm::BasicBlock_*,_bool,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_bool>_>_>
                              *)auStack_420,ppBVar34);
      *pmVar17 = true;
      pBVar29 = (BasicBlock *)(*(long *)((long)pSVar19 + 0x50) + -0x18);
      if (*(long *)((long)pSVar19 + 0x50) == 0) {
        pBVar29 = (BasicBlock *)0x0;
      }
      lVar40 = llvm::BasicBlock::getTerminator();
      if (lVar40 != 0) {
        iVar8 = llvm::Instruction::getNumSuccessors();
        if (iVar8 == 0) {
          pBVar18 = (BasicBlock *)0x0;
        }
        else {
          uVar9 = llvm::BasicBlock::getTerminator();
          ppBVar34 = (key_type *)0x0;
          pBVar18 = (BasicBlock *)llvm::Instruction::getSuccessor(uVar9);
        }
      }
      pSVar19 = std::_Vector_base<StackNode,_std::allocator<StackNode>_>::_M_allocate
                          ((_Vector_base<StackNode,_std::allocator<StackNode>_> *)0x1,
                           (size_t)ppBVar34);
      pSVar19->block = pBVar29;
      pSVar19->next_succ = pBVar18;
      pSStack_438 = pSVar19 + 1;
      uVar33 = 0;
      uStack_430 = 1;
      iStack_428 = 0;
      iStack_424 = 0;
      pSVar43 = pSStack_438;
      do {
        pSVar30 = pSVar43 + -1;
        pBStack_440 = pSVar43[-1].next_succ;
        pSVar21 = pSVar19;
        if (pBStack_440 == (key_type)0x0) {
          pmVar17 = std::
                    map<const_llvm::BasicBlock_*,_bool,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_bool>_>_>
                    ::operator[]((map<const_llvm::BasicBlock_*,_bool,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_bool>_>_>
                                  *)auStack_420,&pSVar30->block);
          *pmVar17 = false;
        }
        else {
          lVar40 = llvm::BasicBlock::getTerminator();
          iVar8 = 0;
          if (lVar40 != 0) {
            iVar8 = llvm::Instruction::getNumSuccessors();
          }
          uVar9 = (uint)lVar40;
          iVar38 = 0;
          if (iVar8 != 0) {
            iVar31 = 0;
            do {
              pBVar18 = (BasicBlock *)llvm::Instruction::getSuccessor(uVar9);
              iVar38 = iVar31;
              if (pBVar18 == pSVar43[-1].next_succ) break;
              iVar31 = iVar31 + 1;
              iVar38 = iVar8;
            } while (iVar8 != iVar31);
          }
          llvm::Instruction::getSuccessor(uVar9);
          iVar31 = iVar38;
          while ((iVar38 != iVar8 &&
                 (pBVar18 = (BasicBlock *)llvm::Instruction::getSuccessor(uVar9), iVar31 = iVar38,
                 pBVar18 == pSVar43[-1].next_succ))) {
            iVar38 = iVar38 + 1;
            iVar31 = iVar8;
          }
          if (iVar31 == iVar8) {
            pBVar18 = (BasicBlock *)0x0;
          }
          else {
            pBVar18 = (BasicBlock *)llvm::Instruction::getSuccessor(uVar9);
          }
          pSVar43[-1].next_succ = pBVar18;
          p_Var1 = (_Link_type)(auStack_420 + 8);
          p_Var20 = p_Var1;
          for (p_Var25 = p_Stack_410; p_Var25 != (_Link_type)0x0;
              p_Var25 = *(_Link_type *)((long)(&p_Var25->_M_storage + -1) + (ulong)bVar44 * 8)) {
            bVar44 = *(key_type *)(p_Var25->_M_storage)._M_storage < pBStack_440;
            if (!bVar44) {
              p_Var20 = p_Var25;
            }
          }
          p_Var25 = p_Var1;
          if ((p_Var20 != p_Var1) &&
             (p_Var25 = p_Var20, pBStack_440 < *(key_type *)(p_Var20->_M_storage)._M_storage)) {
            p_Var25 = p_Var1;
          }
          if (p_Var25 == p_Var1) {
            ppBVar34 = &pBStack_440;
            pmVar17 = std::
                      map<const_llvm::BasicBlock_*,_bool,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_bool>_>_>
                      ::operator[]((map<const_llvm::BasicBlock_*,_bool,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_bool>_>_>
                                    *)auStack_420,ppBVar34);
            *pmVar17 = true;
            lVar40 = llvm::BasicBlock::getTerminator();
            if (lVar40 == 0) {
              pBVar18 = (BasicBlock *)0x0;
              pSVar30 = pSStack_438;
            }
            else {
              iVar8 = llvm::Instruction::getNumSuccessors();
              pSVar30 = pSStack_438;
              if (iVar8 == 0) {
                pBVar18 = (BasicBlock *)0x0;
              }
              else {
                uVar9 = llvm::BasicBlock::getTerminator();
                ppBVar34 = (key_type *)0x0;
                pBVar18 = (BasicBlock *)llvm::Instruction::getSuccessor(uVar9);
              }
            }
            if (pSVar43 == pSVar30) {
              lVar40 = (long)pSVar43 - (long)pSVar19;
              uStack_3f0 = uVar33;
              if (lVar40 == 0x7ffffffffffffff0) {
                std::__throw_length_error("vector::_M_realloc_insert");
              }
              p_Var26 = (_Vector_base<StackNode,_std::allocator<StackNode>_> *)(lVar40 >> 3);
              this = (_Vector_base<StackNode,_std::allocator<StackNode>_> *)0x7ffffffffffffff;
              if (p_Var26 < (_Vector_base<StackNode,_std::allocator<StackNode>_> *)0x7ffffffffffffff
                 ) {
                this = p_Var26;
              }
              if (p_Var26 < (_Vector_base<StackNode,_std::allocator<StackNode>_> *)(lVar40 >> 4)) {
                this = (_Vector_base<StackNode,_std::allocator<StackNode>_> *)0x7ffffffffffffff;
              }
              pSVar21 = std::_Vector_base<StackNode,_std::allocator<StackNode>_>::_M_allocate
                                  (this,(size_t)ppBVar34);
              uVar33 = uStack_3f0;
              *(key_type *)((long)pSVar21 + lVar40) = pBStack_440;
              *(BasicBlock **)((long)pSVar21 + lVar40 + 8) = pBVar18;
              pSVar30 = pSVar21 + 1;
              pSVar37 = pSVar19;
              do {
                pBVar18 = pSVar37->next_succ;
                pSVar30[-1].block = pSVar37->block;
                pSVar30[-1].next_succ = pBVar18;
                pSVar37 = pSVar37 + 1;
                pSVar30 = pSVar30 + 1;
              } while (pSVar37 != pSVar43);
              if (pSVar19 != (pointer)0x0) {
                operator_delete(pSVar19,(long)pSStack_438 - (long)pSVar19);
              }
              pSStack_438 = pSVar21 + (long)this;
            }
            else {
              pSVar43->block = pBStack_440;
              pSVar43->next_succ = pBVar18;
              pSVar30 = pSVar43 + 1;
            }
            uVar22 = (long)pSVar30 - (long)pSVar21 >> 4;
            if (uStack_430 <= uVar22) {
              uStack_430 = uVar22;
            }
          }
          else {
            iStack_428 = iStack_428 + 1;
            uVar9 = (uint)(p_Var25->_M_storage)._M_storage[8];
            uVar33 = (ulong)((int)uVar33 + uVar9);
            iStack_424 = iStack_424 + (uVar9 ^ 1);
            (p_Var25->_M_storage)._M_storage[8] = '\0';
          }
        }
        pSVar19 = pSVar21;
        pSVar43 = pSVar30;
        if (pSVar21 == pSVar30) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  DFS tree edges: ",0x12);
          poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  DFS nontree edges: ",0x15);
          poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  DFS forward: ",0xf);
          poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  DFS backedges: ",0x11);
          poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  DFS max depth: ",0x11);
          poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
          if (pSVar21 != (pointer)0x0) {
            operator_delete(pSVar21,(long)pSStack_438 - (long)pSVar21);
          }
          std::
          _Rb_tree<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_bool>,_std::_Select1st<std::pair<const_llvm::BasicBlock_*const,_bool>_>,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_bool>_>_>
          ::_M_erase((_Rb_tree<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_bool>,_std::_Select1st<std::pair<const_llvm::BasicBlock_*const,_bool>_>,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_bool>_>_>
                      *)auStack_420,p_Stack_410);
          return extraout_EAX;
        }
      } while( true );
    }
    (*(code *)quiet._184_8_)(0x1102f8,local_368);
  }
  llvm::LLVMContext::LLVMContext((LLVMContext *)local_2a8);
  parseModule(local_3a0,(LLVMContext *)"llvm-cda-bench",(SlicerOptions *)local_2a8);
  auVar5 = local_3a0;
  if (local_3a0 != (undefined1  [8])0x0) {
    if (fun_info_only[0x80] == '\x01') {
      iVar8 = 0;
      for (pMVar23 = *(Module **)((long)local_3a0 + 0x20);
          pMVar23 != (Module *)((long)local_3a0 + 0x18U); pMVar23 = *(Module **)(pMVar23 + 8)) {
        pFVar41 = (Function *)(pMVar23 + -0x38);
        if (pMVar23 == (Module *)0x0) {
          pFVar41 = (Function *)0x0;
        }
        cVar7 = llvm::GlobalValue::isDeclaration();
        if (cVar7 == '\0') {
          dumpFunStats(pFVar41);
        }
      }
    }
    else {
      local_398.
      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_398.
      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_398.
      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (scd[0x80] == '\x01') {
        local_138 = STANDARD;
        pLVar10 = (LLVMControlDependenceAnalysis *)operator_new(0x78);
        local_368._0_8_ = (_Base_ptr)(local_368 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_368,local_190,local_190 + local_188._M_allocated_capacity);
        local_368._32_8_ = local_170._M_head_impl;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_Rb_tree(&local_340,&local_168);
        local_30c = (bool)local_134;
        local_310 = local_138;
        local_30b = local_133;
        dg::LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
                  (pLVar10,(Module *)auVar5,(LLVMControlDependenceAnalysisOptions *)local_368,
                   (LLVMPointerAnalysis *)0x0);
        local_3b8._0_8_ = pLVar10;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_M_erase(&local_340,
                   (_Link_type)local_340._M_impl.super__Rb_tree_header._M_header._M_parent);
        if ((_Base_ptr)local_368._0_8_ != (_Base_ptr)(local_368 + 0x10)) {
          operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
        }
        local_368._0_8_ = local_368._0_8_ & 0xffffffff00000000;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[4],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&local_398,(char (*) [4])0x10c2e8,
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)local_3b8,(int *)local_368);
        if ((_Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
             )local_3b8._0_8_ != (LLVMControlDependenceAnalysis *)0x0) {
          std::default_delete<dg::LLVMControlDependenceAnalysis>::operator()
                    ((default_delete<dg::LLVMControlDependenceAnalysis> *)local_3b8,
                     (LLVMControlDependenceAnalysis *)local_3b8._0_8_);
        }
      }
      auVar5 = local_3a0;
      if (ntscd[0x80] == '\x01') {
        local_138 = NTSCD;
        tVar11.
        super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
        .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
              )operator_new(0x78);
        local_368._0_8_ = (_Base_ptr)(local_368 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_368,local_190,local_190 + local_188._M_allocated_capacity);
        local_368._32_8_ = local_170._M_head_impl;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_Rb_tree(&local_340,&local_168);
        local_30c = (bool)local_134;
        local_310 = local_138;
        local_30b = local_133;
        dg::LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
                  ((LLVMControlDependenceAnalysis *)
                   tVar11.
                   super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                   .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>._M_head_impl,
                   (Module *)auVar5,(LLVMControlDependenceAnalysisOptions *)local_368,
                   (LLVMPointerAnalysis *)0x0);
        local_3b8._0_8_ =
             tVar11.
             super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
             .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>._M_head_impl;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_M_erase(&local_340,
                   (_Link_type)local_340._M_impl.super__Rb_tree_header._M_header._M_parent);
        if ((_Base_ptr)local_368._0_8_ != (_Base_ptr)(local_368 + 0x10)) {
          operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
        }
        local_368._0_8_ = local_368._0_8_ & 0xffffffff00000000;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[6],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&local_398,(char (*) [6])0x10c2e6,
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)local_3b8,(int *)local_368);
        if ((LLVMControlDependenceAnalysis *)local_3b8._0_8_ != (LLVMControlDependenceAnalysis *)0x0
           ) {
          std::default_delete<dg::LLVMControlDependenceAnalysis>::operator()
                    ((default_delete<dg::LLVMControlDependenceAnalysis> *)local_3b8,
                     (LLVMControlDependenceAnalysis *)local_3b8._0_8_);
        }
      }
      auVar5 = local_3a0;
      if (ntscd2[0x80] == '\x01') {
        local_138 = NTSCD2;
        pLVar10 = (LLVMControlDependenceAnalysis *)operator_new(0x78);
        local_368._0_8_ = (_Base_ptr)(local_368 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_368,local_190,local_190 + local_188._M_allocated_capacity);
        local_368._32_8_ = local_170._M_head_impl;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_Rb_tree(&local_340,&local_168);
        local_30c = (bool)local_134;
        local_310 = local_138;
        local_30b = local_133;
        dg::LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
                  (pLVar10,(Module *)auVar5,(LLVMControlDependenceAnalysisOptions *)local_368,
                   (LLVMPointerAnalysis *)0x0);
        local_3b8._0_8_ = pLVar10;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_M_erase(&local_340,
                   (_Link_type)local_340._M_impl.super__Rb_tree_header._M_header._M_parent);
        if ((_Base_ptr)local_368._0_8_ != (_Base_ptr)(local_368 + 0x10)) {
          operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
        }
        local_368._0_8_ = local_368._0_8_ & 0xffffffff00000000;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[7],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&local_398,(char (*) [7])"ntscd2",
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)local_3b8,(int *)local_368);
        if ((_Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
             )local_3b8._0_8_ != (LLVMControlDependenceAnalysis *)0x0) {
          std::default_delete<dg::LLVMControlDependenceAnalysis>::operator()
                    ((default_delete<dg::LLVMControlDependenceAnalysis> *)local_3b8,
                     (LLVMControlDependenceAnalysis *)local_3b8._0_8_);
        }
      }
      auVar5 = local_3a0;
      if (ntscd_ranganath[0x80] == '\x01') {
        local_138 = NTSCD_RANGANATH;
        pLVar10 = (LLVMControlDependenceAnalysis *)operator_new(0x78);
        local_368._0_8_ = (_Base_ptr)(local_368 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_368,local_190,local_190 + local_188._M_allocated_capacity);
        local_368._32_8_ = local_170._M_head_impl;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_Rb_tree(&local_340,&local_168);
        local_30c = (bool)local_134;
        local_310 = local_138;
        local_30b = local_133;
        dg::LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
                  (pLVar10,(Module *)auVar5,(LLVMControlDependenceAnalysisOptions *)local_368,
                   (LLVMPointerAnalysis *)0x0);
        local_3b8._0_8_ = pLVar10;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_M_erase(&local_340,
                   (_Link_type)local_340._M_impl.super__Rb_tree_header._M_header._M_parent);
        if ((_Base_ptr)local_368._0_8_ != (_Base_ptr)(local_368 + 0x10)) {
          operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
        }
        local_368._0_8_ = local_368._0_8_ & 0xffffffff00000000;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[16],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&local_398,(char (*) [16])"ntscd-ranganath",
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)local_3b8,(int *)local_368);
        if ((_Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
             )local_3b8._0_8_ != (LLVMControlDependenceAnalysis *)0x0) {
          std::default_delete<dg::LLVMControlDependenceAnalysis>::operator()
                    ((default_delete<dg::LLVMControlDependenceAnalysis> *)local_3b8,
                     (LLVMControlDependenceAnalysis *)local_3b8._0_8_);
        }
      }
      auVar5 = local_3a0;
      if (ntscd_ranganath_wrong[0x80] == '\x01') {
        local_138 = NTSCD_RANGANATH_ORIG;
        tVar11.
        super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
        .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
              )operator_new(0x78);
        local_368._0_8_ = (_Base_ptr)(local_368 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_368,local_190,local_190 + local_188._M_allocated_capacity);
        local_368._32_8_ = local_170._M_head_impl;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_Rb_tree(&local_340,&local_168);
        local_30c = (bool)local_134;
        local_310 = local_138;
        local_30b = local_133;
        dg::LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
                  ((LLVMControlDependenceAnalysis *)
                   tVar11.
                   super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                   .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>._M_head_impl,
                   (Module *)auVar5,(LLVMControlDependenceAnalysisOptions *)local_368,
                   (LLVMPointerAnalysis *)0x0);
        local_3b8._0_8_ =
             tVar11.
             super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
             .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>._M_head_impl;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_M_erase(&local_340,
                   (_Link_type)local_340._M_impl.super__Rb_tree_header._M_header._M_parent);
        if ((_Base_ptr)local_368._0_8_ != (_Base_ptr)(local_368 + 0x10)) {
          operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
        }
        local_368._0_8_ = local_368._0_8_ & 0xffffffff00000000;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[22],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&local_398,(char (*) [22])"ntscd-ranganath-wrong",
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)local_3b8,(int *)local_368);
        if ((LLVMControlDependenceAnalysis *)local_3b8._0_8_ != (LLVMControlDependenceAnalysis *)0x0
           ) {
          std::default_delete<dg::LLVMControlDependenceAnalysis>::operator()
                    ((default_delete<dg::LLVMControlDependenceAnalysis> *)local_3b8,
                     (LLVMControlDependenceAnalysis *)local_3b8._0_8_);
        }
      }
      auVar5 = local_3a0;
      if (ntscd_legacy[0x80] == '\x01') {
        local_138 = NTSCD_LEGACY;
        pLVar10 = (LLVMControlDependenceAnalysis *)operator_new(0x78);
        local_368._0_8_ = (_Base_ptr)(local_368 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_368,local_190,local_190 + local_188._M_allocated_capacity);
        local_368._32_8_ = local_170._M_head_impl;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_Rb_tree(&local_340,&local_168);
        local_30c = (bool)local_134;
        local_310 = local_138;
        local_30b = local_133;
        dg::LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
                  (pLVar10,(Module *)auVar5,(LLVMControlDependenceAnalysisOptions *)local_368,
                   (LLVMPointerAnalysis *)0x0);
        local_3b8._0_8_ = pLVar10;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_M_erase(&local_340,
                   (_Link_type)local_340._M_impl.super__Rb_tree_header._M_header._M_parent);
        if ((_Base_ptr)local_368._0_8_ != (_Base_ptr)(local_368 + 0x10)) {
          operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
        }
        local_368._0_8_ = local_368._0_8_ & 0xffffffff00000000;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[13],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&local_398,(char (*) [13])"ntscd-legacy",
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)local_3b8,(int *)local_368);
        if ((_Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
             )local_3b8._0_8_ != (LLVMControlDependenceAnalysis *)0x0) {
          std::default_delete<dg::LLVMControlDependenceAnalysis>::operator()
                    ((default_delete<dg::LLVMControlDependenceAnalysis> *)local_3b8,
                     (LLVMControlDependenceAnalysis *)local_3b8._0_8_);
        }
      }
      auVar5 = local_3a0;
      if (dod[0x80] == '\x01') {
        local_138 = DOD;
        pLVar10 = (LLVMControlDependenceAnalysis *)operator_new(0x78);
        local_368._0_8_ = (_Base_ptr)(local_368 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_368,local_190,local_190 + local_188._M_allocated_capacity);
        local_368._32_8_ = local_170._M_head_impl;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_Rb_tree(&local_340,&local_168);
        local_30c = (bool)local_134;
        local_310 = local_138;
        local_30b = local_133;
        dg::LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
                  (pLVar10,(Module *)auVar5,(LLVMControlDependenceAnalysisOptions *)local_368,
                   (LLVMPointerAnalysis *)0x0);
        local_3b8._0_8_ = pLVar10;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_M_erase(&local_340,
                   (_Link_type)local_340._M_impl.super__Rb_tree_header._M_header._M_parent);
        if ((_Base_ptr)local_368._0_8_ != (_Base_ptr)(local_368 + 0x10)) {
          operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
        }
        local_368._0_8_ = local_368._0_8_ & 0xffffffff00000000;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[4],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&local_398,(char (*) [4])"dod",
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)local_3b8,(int *)local_368);
        if ((_Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
             )local_3b8._0_8_ != (LLVMControlDependenceAnalysis *)0x0) {
          std::default_delete<dg::LLVMControlDependenceAnalysis>::operator()
                    ((default_delete<dg::LLVMControlDependenceAnalysis> *)local_3b8,
                     (LLVMControlDependenceAnalysis *)local_3b8._0_8_);
        }
      }
      auVar5 = local_3a0;
      if (dod_ranganath[0x80] == '\x01') {
        local_138 = DOD_RANGANATH;
        tVar11.
        super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
        .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
              )operator_new(0x78);
        local_368._0_8_ = (_Base_ptr)(local_368 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_368,local_190,local_190 + local_188._M_allocated_capacity);
        local_368._32_8_ = local_170._M_head_impl;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_Rb_tree(&local_340,&local_168);
        local_30c = (bool)local_134;
        local_310 = local_138;
        local_30b = local_133;
        dg::LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
                  ((LLVMControlDependenceAnalysis *)
                   tVar11.
                   super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                   .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>._M_head_impl,
                   (Module *)auVar5,(LLVMControlDependenceAnalysisOptions *)local_368,
                   (LLVMPointerAnalysis *)0x0);
        local_3b8._0_8_ =
             tVar11.
             super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
             .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>._M_head_impl;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_M_erase(&local_340,
                   (_Link_type)local_340._M_impl.super__Rb_tree_header._M_header._M_parent);
        if ((_Base_ptr)local_368._0_8_ != (_Base_ptr)(local_368 + 0x10)) {
          operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
        }
        local_368._0_8_ = local_368._0_8_ & 0xffffffff00000000;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[14],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&local_398,(char (*) [14])"dod-ranganath",
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)local_3b8,(int *)local_368);
        if ((LLVMControlDependenceAnalysis *)local_3b8._0_8_ != (LLVMControlDependenceAnalysis *)0x0
           ) {
          std::default_delete<dg::LLVMControlDependenceAnalysis>::operator()
                    ((default_delete<dg::LLVMControlDependenceAnalysis> *)local_3b8,
                     (LLVMControlDependenceAnalysis *)local_3b8._0_8_);
        }
      }
      auVar5 = local_3a0;
      if (dod_ntscd[0x80] == '\x01') {
        local_138 = DODNTSCD;
        pLVar10 = (LLVMControlDependenceAnalysis *)operator_new(0x78);
        local_368._0_8_ = (_Base_ptr)(local_368 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_368,local_190,local_190 + local_188._M_allocated_capacity);
        local_368._32_8_ = local_170._M_head_impl;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_Rb_tree(&local_340,&local_168);
        local_30c = (bool)local_134;
        local_310 = local_138;
        local_30b = local_133;
        dg::LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
                  (pLVar10,(Module *)auVar5,(LLVMControlDependenceAnalysisOptions *)local_368,
                   (LLVMPointerAnalysis *)0x0);
        local_3b8._0_8_ = pLVar10;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_M_erase(&local_340,
                   (_Link_type)local_340._M_impl.super__Rb_tree_header._M_header._M_parent);
        if ((_Base_ptr)local_368._0_8_ != (_Base_ptr)(local_368 + 0x10)) {
          operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
        }
        local_368._0_8_ = local_368._0_8_ & 0xffffffff00000000;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[10],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&local_398,(char (*) [10])"dod+ntscd",
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)local_3b8,(int *)local_368);
        if ((_Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
             )local_3b8._0_8_ != (LLVMControlDependenceAnalysis *)0x0) {
          std::default_delete<dg::LLVMControlDependenceAnalysis>::operator()
                    ((default_delete<dg::LLVMControlDependenceAnalysis> *)local_3b8,
                     (LLVMControlDependenceAnalysis *)local_3b8._0_8_);
        }
      }
      auVar5 = local_3a0;
      if (scc[0x80] == '\x01') {
        local_138 = STRONG_CC;
        pLVar10 = (LLVMControlDependenceAnalysis *)operator_new(0x78);
        local_368._0_8_ = (_Base_ptr)(local_368 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_368,local_190,local_190 + local_188._M_allocated_capacity);
        local_368._32_8_ = local_170._M_head_impl;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_Rb_tree(&local_340,&local_168);
        local_30c = (bool)local_134;
        local_310 = local_138;
        local_30b = local_133;
        dg::LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
                  (pLVar10,(Module *)auVar5,(LLVMControlDependenceAnalysisOptions *)local_368,
                   (LLVMPointerAnalysis *)0x0);
        local_3b8._0_8_ = pLVar10;
        std::
        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
        ::_M_erase(&local_340,
                   (_Link_type)local_340._M_impl.super__Rb_tree_header._M_header._M_parent);
        if ((_Base_ptr)local_368._0_8_ != (_Base_ptr)(local_368 + 0x10)) {
          operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
        }
        local_368._0_8_ = local_368._0_8_ & 0xffffffff00000000;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[4],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&local_398,(char (*) [4])"scc",
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)local_3b8,(int *)local_368);
        if ((_Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
             )local_3b8._0_8_ != (LLVMControlDependenceAnalysis *)0x0) {
          std::default_delete<dg::LLVMControlDependenceAnalysis>::operator()
                    ((default_delete<dg::LLVMControlDependenceAnalysis> *)local_3b8,
                     (LLVMControlDependenceAnalysis *)local_3b8._0_8_);
        }
      }
      if (local_398.
          super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_398.
          super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Warning: No analysis to run specified, dumping just info about funs\n",0x44);
      }
      p_Var15 = *(_Base_ptr *)((long)local_3a0 + 0x20);
      p_Var27 = (_Base_ptr)((long)local_3a0 + 0x18);
      p_Var6 = p_Var27;
      if (p_Var15 != p_Var27) {
        do {
          local_378 = p_Var6;
          pFVar41 = (Function *)&p_Var15[-2]._M_parent;
          if (p_Var15 == (_Base_ptr)0x0) {
            pFVar41 = (Function *)0x0;
          }
          cVar7 = llvm::GlobalValue::isDeclaration();
          if (cVar7 == '\0') {
            ptVar32 = local_398.
                      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ptVar42 = local_398.
                      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (quiet[0x80] == '\0') {
              dumpFunStats(pFVar41);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Elapsed time: \n",0xf);
              ptVar32 = local_398.
                        super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ptVar42 = local_398.
                        super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
            for (; p_Var27 = local_378, ptVar32 != ptVar42; ptVar32 = ptVar32 + 1) {
              cVar12 = clock();
              _Var2._M_head_impl =
                   (ptVar32->
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                   ).
                   super__Tuple_impl<1UL,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                   .
                   super__Head_base<1UL,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_false>
                   ._M_head_impl._M_t.
                   super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                   .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>._M_head_impl;
              uVar3._M_t.
              super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
              ._M_t.
              super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
              .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false>._M_head_impl =
                   ((_Var2._M_head_impl)->_impl)._M_t;
              (**(code **)(*(long *)uVar3._M_t.
                                    super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
                                    .
                                    super__Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false>
                                    ._M_head_impl + 0x20))
                        (uVar3._M_t.
                         super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
                         .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false>.
                         _M_head_impl,pFVar41);
              if (*(bool *)((long)&(_Var2._M_head_impl)->_options + 0x5c) == true) {
                uVar3._M_t.
                super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
                ._M_t.
                super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
                .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false>._M_head_impl
                     = ((_Var2._M_head_impl)->_interprocImpl)._M_t;
                (**(code **)(*(long *)uVar3._M_t.
                                      super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
                                      .
                                      super__Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false>
                                      ._M_head_impl + 0x20))
                          (uVar3._M_t.
                           super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
                           .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false>.
                           _M_head_impl,pFVar41);
              }
              cVar13 = clock();
              (ptVar32->
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
              ).
              super__Tuple_impl<1UL,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
              .super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>.
              _M_head_impl = (ptVar32->
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                             ).
                             super__Tuple_impl<1UL,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                             .super__Tuple_impl<2UL,_unsigned_long>.
                             super__Head_base<2UL,_unsigned_long,_false>._M_head_impl +
                             (cVar13 - cVar12);
              if (quiet[0x80] == '\0') {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     (ptVar32->
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                                     ).
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                     ._M_head_impl._M_dataplus._M_p,
                                     (ptVar32->
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                                     ).
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                     ._M_head_impl._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,": ",2);
                poVar14 = std::ostream::_M_insert<double>
                                    ((double)((float)(cVar13 - cVar12) / 1e+06));
                std::__ostream_insert<char,std::char_traits<char>>(poVar14," s (",4);
                poVar14 = std::ostream::_M_insert<long>((long)poVar14);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14," ticks)\n",8);
              }
            }
            if (quiet[0x80] == '\0') {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-----",5);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
              std::ostream::put(' ');
              std::ostream::flush();
            }
          }
          p_Var15 = p_Var15->_M_parent;
          p_Var6 = local_378;
        } while (p_Var15 != p_Var27);
      }
      if ((quiet[0x80] == '\0') || (total_only[0x80] == '\x01')) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Total elapsed time:\n",0x14);
        ptVar32 = local_398.
                  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ptVar42 = local_398.
                       super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; ptVar42 != ptVar32;
            ptVar42 = ptVar42 + 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               (ptVar42->
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                               ).
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                               ._M_head_impl._M_dataplus._M_p,
                               (ptVar42->
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                               ).
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                               ._M_head_impl._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,": ",2);
          poVar14 = std::ostream::_M_insert<double>
                              ((double)((float)(ptVar42->
                                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                                               ).
                                               super__Tuple_impl<1UL,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                                               .super__Tuple_impl<2UL,_unsigned_long>.
                                               super__Head_base<2UL,_unsigned_long,_false>.
                                               _M_head_impl / 1e+06));
          std::__ostream_insert<char,std::char_traits<char>>(poVar14," s (",4);
          poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14," ticks)",7);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
          std::ostream::put((char)poVar14);
          std::ostream::flush();
        }
      }
      if (compare[0x80] == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\n ==== Comparison ====\n",0x17);
        pMVar23 = *(Module **)((long)local_3a0 + 0x20);
        pMVar28 = (Module *)((long)local_3a0 + 0x18);
        pMVar39 = pMVar28;
        if (pMVar23 != pMVar28) {
          do {
            local_2d0 = pMVar39;
            pMVar39 = pMVar23 + -0x38;
            if (pMVar23 == (Module *)0x0) {
              pMVar39 = (Module *)0x0;
            }
            cVar7 = llvm::GlobalValue::isDeclaration();
            if (cVar7 == '\0') {
              local_368._0_8_ = (_Base_ptr)0x0;
              local_368._8_8_ = (_Base_ptr)0x0;
              local_368._16_8_ = 0;
              local_2c8 = pMVar23;
              std::
              vector<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
              ::resize((vector<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
                        *)local_368,
                       ((long)local_398.
                              super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_398.
                              super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555)
              ;
              local_2f0 = local_398.
                          super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              local_2c0 = local_398.
                          super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              local_2e8 = pMVar39;
              if (local_398.
                  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_398.
                  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                local_2e0 = pMVar39 + 0x48;
                local_36c = 0;
                do {
                  pMVar23 = *(Module **)(local_2e8 + 0x50);
                  if (pMVar23 != local_2e0) {
                    local_2d8 = (local_2f0->
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                                ).
                                super__Tuple_impl<1UL,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                                .
                                super__Head_base<1UL,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_false>
                                ._M_head_impl._M_t.
                                super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                                .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>.
                                _M_head_impl;
                    uVar33 = (ulong)local_36c;
                    do {
                      pMVar28 = pMVar23 + -0x18;
                      if (pMVar23 == (Module *)0x0) {
                        pMVar28 = (Module *)0x0;
                      }
                      local_2b8 = pMVar23;
                      dg::LLVMControlDependenceAnalysis::_getDependencies<llvm::BasicBlock_const*>
                                ((LLVMControlDependenceAnalysis *)local_3b8,(BasicBlock *)local_2d8)
                      ;
                      uVar4 = local_3b8._8_8_;
                      for (pLVar10 = (LLVMControlDependenceAnalysis *)local_3b8._0_8_;
                          pLVar10 != (LLVMControlDependenceAnalysis *)uVar4;
                          pLVar10 = (LLVMControlDependenceAnalysis *)&pLVar10->_options) {
                        local_2f8 = pLVar10->_module;
                        local_300 = pMVar28;
                        std::
                        _Rb_tree<std::pair<llvm::Value_const*,llvm::Value_const*>,std::pair<llvm::Value_const*,llvm::Value_const*>,std::_Identity<std::pair<llvm::Value_const*,llvm::Value_const*>>,std::less<std::pair<llvm::Value_const*,llvm::Value_const*>>,std::allocator<std::pair<llvm::Value_const*,llvm::Value_const*>>>
                        ::_M_emplace_unique<llvm::Value*&,llvm::BasicBlock*>
                                  ((_Rb_tree<std::pair<llvm::Value_const*,llvm::Value_const*>,std::pair<llvm::Value_const*,llvm::Value_const*>,std::_Identity<std::pair<llvm::Value_const*,llvm::Value_const*>>,std::less<std::pair<llvm::Value_const*,llvm::Value_const*>>,std::allocator<std::pair<llvm::Value_const*,llvm::Value_const*>>>
                                    *)(local_368._0_8_ + uVar33 * 0x30),(Value **)&local_2f8,
                                   (BasicBlock **)&local_300);
                      }
                      if ((_Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                           )local_3b8._0_8_ != (LLVMControlDependenceAnalysis *)0x0) {
                        operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ - local_3b8._0_8_);
                      }
                      p_Var15 = *(_Base_ptr *)(pMVar28 + 0x30);
                      local_2b0 = (_Base_ptr)(pMVar28 + 0x28);
                      if (p_Var15 != local_2b0) {
                        do {
                          pMVar23 = (Module *)&p_Var15[-1]._M_parent;
                          if (p_Var15 == (_Base_ptr)0x0) {
                            pMVar23 = (Module *)0x0;
                          }
                          local_378 = p_Var15;
                          dg::LLVMControlDependenceAnalysis::
                          _getDependencies<llvm::Instruction_const*>
                                    ((LLVMControlDependenceAnalysis *)local_3b8,
                                     (Instruction *)local_2d8);
                          uVar4 = local_3b8._8_8_;
                          for (pLVar10 = (LLVMControlDependenceAnalysis *)local_3b8._0_8_;
                              pLVar10 != (LLVMControlDependenceAnalysis *)uVar4;
                              pLVar10 = (LLVMControlDependenceAnalysis *)&pLVar10->_options) {
                            local_2f8 = pLVar10->_module;
                            local_300 = pMVar23;
                            std::
                            _Rb_tree<std::pair<llvm::Value_const*,llvm::Value_const*>,std::pair<llvm::Value_const*,llvm::Value_const*>,std::_Identity<std::pair<llvm::Value_const*,llvm::Value_const*>>,std::less<std::pair<llvm::Value_const*,llvm::Value_const*>>,std::allocator<std::pair<llvm::Value_const*,llvm::Value_const*>>>
                            ::_M_emplace_unique<llvm::Value*&,llvm::Instruction*>
                                      ((_Rb_tree<std::pair<llvm::Value_const*,llvm::Value_const*>,std::pair<llvm::Value_const*,llvm::Value_const*>,std::_Identity<std::pair<llvm::Value_const*,llvm::Value_const*>>,std::less<std::pair<llvm::Value_const*,llvm::Value_const*>>,std::allocator<std::pair<llvm::Value_const*,llvm::Value_const*>>>
                                        *)(local_368._0_8_ + uVar33 * 0x30),(Value **)&local_2f8,
                                       (Instruction **)&local_300);
                          }
                          if ((tuple<dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                               )local_3b8._0_8_ !=
                              (_Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>)0x0) {
                            operator_delete((void *)local_3b8._0_8_,
                                            local_3b8._16_8_ - local_3b8._0_8_);
                          }
                          p_Var15 = local_378->_M_parent;
                        } while (p_Var15 != local_2b0);
                      }
                      pMVar23 = *(Module **)(local_2b8 + 8);
                    } while (pMVar23 != local_2e0);
                  }
                  local_36c = local_36c + 1;
                  local_2f0 = local_2f0 + 1;
                } while (local_2f0 != local_2c0);
              }
              if (local_368._8_8_ != local_368._0_8_) {
                p_Var15 = (_Base_ptr)0x0;
                do {
                  pMVar23 = local_2e8;
                  local_378 = p_Var15;
                  if ((int)p_Var15 != 0) {
                    lVar40 = 0;
                    do {
                      compareResults((set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>
                                      *)(local_368._0_8_ + (long)p_Var15 * 0x30),
                                     (set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>
                                      *)(local_368._0_8_ + lVar40),
                                     (string *)
                                     ((long)local_398.
                                            super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                      (long)p_Var15 * 0x30 + 0x10),
                                     (string *)
                                     ((long)local_398.
                                            super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar40 +
                                     0x10),(Function *)pMVar23);
                      lVar40 = lVar40 + 0x30;
                    } while ((long)p_Var15 * 0x30 != lVar40);
                  }
                  p_Var15 = (_Base_ptr)(ulong)((int)local_378 + 1);
                  p_Var27 = (_Base_ptr)
                            (((long)(local_368._8_8_ - local_368._0_8_) >> 4) * -0x5555555555555555)
                  ;
                } while (p_Var15 <= p_Var27 && (long)p_Var27 - (long)p_Var15 != 0);
              }
              std::
              vector<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
              ::~vector((vector<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
                         *)local_368);
              pMVar28 = local_2d0;
              pMVar23 = local_2c8;
            }
            pMVar23 = *(Module **)(pMVar23 + 8);
            pMVar39 = local_2d0;
          } while (pMVar23 != pMVar28);
        }
      }
      std::
      vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
      ::~vector(&local_398);
      iVar8 = 0;
    }
  }
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr
            ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)local_3a0);
  llvm::LLVMContext::~LLVMContext((LLVMContext *)local_2a8);
  SlicerOptions::~SlicerOptions((SlicerOptions *)(local_2a8 + 8));
  return iVar8;
}

Assistant:

int main(int argc, char *argv[]) {
    setupStackTraceOnError(argc, argv);
    SlicerOptions options = parseSlicerOptions(argc, argv);

    if (enable_debug) {
        DBG_ENABLE();
    }

    if (total_only) {
        quiet = true;
    }

    llvm::LLVMContext context;
    std::unique_ptr<llvm::Module> M =
            parseModule("llvm-cda-bench", context, options);
    if (!M)
        return 1;

    if (fun_info_only) {
        for (auto &F : *M) {
            if (F.isDeclaration()) {
                continue;
            }

            dumpFunStats(F);
        }
        return 0;
    }

    std::vector<
            std::tuple<std::string,
                       std::unique_ptr<LLVMControlDependenceAnalysis>, size_t>>
            analyses;

    clock_t start, end, elapsed;
    auto &opts = options.dgOptions.CDAOptions;
    if (scd) {
        opts.algorithm =
                dg::ControlDependenceAnalysisOptions::CDAlgorithm::STANDARD;
        analyses.emplace_back("scd", createAnalysis(M.get(), opts), 0);
    }
    if (ntscd) {
        opts.algorithm =
                dg::ControlDependenceAnalysisOptions::CDAlgorithm::NTSCD;
        analyses.emplace_back("ntscd", createAnalysis(M.get(), opts), 0);
    }
    if (ntscd2) {
        opts.algorithm =
                dg::ControlDependenceAnalysisOptions::CDAlgorithm::NTSCD2;
        analyses.emplace_back("ntscd2", createAnalysis(M.get(), opts), 0);
    }
    if (ntscd_ranganath) {
        opts.algorithm = dg::ControlDependenceAnalysisOptions::CDAlgorithm::
                NTSCD_RANGANATH;
        analyses.emplace_back("ntscd-ranganath", createAnalysis(M.get(), opts),
                              0);
    }
    if (ntscd_ranganath_wrong) {
        opts.algorithm = dg::ControlDependenceAnalysisOptions::CDAlgorithm::
                NTSCD_RANGANATH_ORIG;
        analyses.emplace_back("ntscd-ranganath-wrong",
                              createAnalysis(M.get(), opts), 0);
    }
    if (ntscd_legacy) {
        opts.algorithm =
                dg::ControlDependenceAnalysisOptions::CDAlgorithm::NTSCD_LEGACY;
        analyses.emplace_back("ntscd-legacy", createAnalysis(M.get(), opts), 0);
    }
    if (dod) {
        opts.algorithm = dg::ControlDependenceAnalysisOptions::CDAlgorithm::DOD;
        analyses.emplace_back("dod", createAnalysis(M.get(), opts), 0);
    }
    if (dod_ranganath) {
        opts.algorithm = dg::ControlDependenceAnalysisOptions::CDAlgorithm::
                DOD_RANGANATH;
        analyses.emplace_back("dod-ranganath", createAnalysis(M.get(), opts),
                              0);
    }
    if (dod_ntscd) {
        opts.algorithm =
                dg::ControlDependenceAnalysisOptions::CDAlgorithm::DODNTSCD;
        analyses.emplace_back("dod+ntscd", createAnalysis(M.get(), opts), 0);
    }
    if (scc) {
        opts.algorithm =
                dg::ControlDependenceAnalysisOptions::CDAlgorithm::STRONG_CC;
        analyses.emplace_back("scc", createAnalysis(M.get(), opts), 0);
    }

    if (analyses.empty()) {
        std::cerr << "Warning: No analysis to run specified, "
                     "dumping just info about funs\n";
    }

    for (auto &F : *M) {
        if (F.isDeclaration()) {
            continue;
        }

        if (!quiet) {
            dumpFunStats(F);
            std::cout << "Elapsed time: \n";
        }

        for (auto &it : analyses) {
            start = clock();
            std::get<1>(it)->compute(&F); // compute all the information
            end = clock();
            elapsed = end - start;
            std::get<2>(it) += elapsed;
            if (!quiet) {
                std::cout << "  " << std::get<0>(it) << ": "
                          << static_cast<float>(elapsed) / CLOCKS_PER_SEC
                          << " s (" << elapsed << " ticks)\n";
            }
        }
        if (!quiet) {
            std::cout << "-----" << std::endl;
        }
    }

    if (!quiet || total_only) {
        std::cout << "Total elapsed time:\n";
        for (auto &it : analyses) {
            std::cout << "  " << std::get<0>(it) << ": "
                      << static_cast<float>(std::get<2>(it)) / CLOCKS_PER_SEC
                      << " s (" << std::get<2>(it) << " ticks)" << std::endl;
        }
    }

    // compare the results if requested
    if (!compare)
        return 0;

    std::cout << "\n ==== Comparison ====\n";
    for (auto &F : *M) {
        if (F.isDeclaration()) {
            continue;
        }

        // not very efficient...
        std::vector<
                std::set<std::pair<const llvm::Value *, const llvm::Value *>>>
                results;
        results.resize(analyses.size());
        unsigned n = 0;
        for (auto &it : analyses) {
            auto *cda = std::get<1>(it).get();
            for (auto &B : F) {
                for (auto *d : cda->getDependencies(&B)) {
                    results[n].emplace(d, &B);
                }

                for (auto &I : B) {
                    for (auto *d : cda->getDependencies(&I)) {
                        results[n].emplace(d, &I);
                    }
                }
            }

            ++n;
        }

        for (n = 0; n < results.size(); ++n) {
            for (unsigned m = 0; m < n; ++m) {
                compareResults(results[n], results[m], std::get<0>(analyses[n]),
                               std::get<0>(analyses[m]), F);
            }
        }
    }

    return 0;
}